

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeTupleExtract(TranslateToFuzzReader *this,Type type)

{
  value_type_conflict2 vVar1;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar2;
  TranslateToFuzzReader *this_00;
  char cVar3;
  uint32_t uVar4;
  Type *pTVar5;
  uintptr_t *puVar6;
  value_type_conflict2 *pvVar7;
  Expression *tuple;
  TupleExtract *pTVar8;
  undefined1 auVar9 [8];
  Iterator __first;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar10;
  Iterator __last;
  Type local_98;
  TranslateToFuzzReader *local_90;
  value_type_conflict2 local_88;
  size_t i;
  size_t injected;
  vector<unsigned_long,_std::allocator<unsigned_long>_> extractIndices;
  undefined1 local_58 [8];
  Iterator __begin1;
  Type type_local;
  Type tupleType;
  
  cVar3 = wasm::Type::isDefaultable();
  if (cVar3 == '\0') {
    pTVar8 = (TupleExtract *)makeTrivial(this,type);
  }
  else {
    if (((byte)this->wasm[0x179] & 2) == 0) {
      __assert_fail("wasm.features.hasMultivalue()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xb01,"Expression *wasm::TranslateToFuzzReader::makeTupleExtract(Type)");
    }
    if ((type.id < 2) || ((type.id & 1) != 0 && 6 < type.id)) {
      __assert_fail("type.isSingle() && type.isConcrete()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xb02,"Expression *wasm::TranslateToFuzzReader::makeTupleExtract(Type)");
    }
    local_90 = this;
    type_local = getTupleType(this);
    extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    injected = 0;
    extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88 = 0;
    __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    local_58 = (undefined1  [8])&type_local;
    PVar10 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)Type::end(&type_local);
    pTVar5 = (Type *)0x0;
    auVar9 = (undefined1  [8])&type_local;
    while (this_00 = local_90, PVar2.index = (size_t)pTVar5, PVar2.parent = (Type *)auVar9,
          PVar10 != PVar2) {
      puVar6 = (uintptr_t *)wasm::Type::Iterator::operator*((Iterator *)local_58);
      if (*puVar6 == type.id) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&injected,&local_88);
      }
      local_88 = local_88 + 1;
      pTVar5 = (Type *)((long)&(__begin1.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent)->id + 1);
      auVar9 = local_58;
      __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = pTVar5;
    }
    if (extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)injected) {
      __last = Type::end(&type_local);
      __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
      __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           &type_local;
      std::vector<wasm::Type,std::allocator<wasm::Type>>::vector<wasm::Type::Iterator,void>
                ((vector<wasm::Type,std::allocator<wasm::Type>> *)local_58,__first,__last,
                 (allocator_type *)&i);
      uVar4 = Random::upTo(&this_00->random,
                           (uint32_t)
                           ((ulong)((long)__begin1.
                                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                          .parent - (long)local_58) >> 3));
      i = (size_t)uVar4;
      ((Type *)((long)local_58 + i * 8))->id = type.id;
      wasm::Type::Type(&local_98,local_58);
      type_local.id = local_98.id;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&injected,&i);
      std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)local_58);
    }
    pvVar7 = Random::pick<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                       (&this_00->random,
                        (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&injected);
    vVar1 = *pvVar7;
    tuple = make(this_00,type_local);
    pTVar8 = Builder::makeTupleExtract(&this_00->builder,tuple,(Index)vVar1);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&injected);
  }
  return (Expression *)pTVar8;
}

Assistant:

Expression* TranslateToFuzzReader::makeTupleExtract(Type type) {
  // Tuples can require locals in binary format conversions.
  if (!type.isDefaultable()) {
    return makeTrivial(type);
  }
  assert(wasm.features.hasMultivalue());
  assert(type.isSingle() && type.isConcrete());
  Type tupleType = getTupleType();

  // Find indices from which we can extract `type`
  std::vector<size_t> extractIndices;
  size_t i = 0;
  for (const auto& t : tupleType) {
    if (t == type) {
      extractIndices.push_back(i);
    }
    ++i;
  }

  // If there are none, inject one
  if (extractIndices.size() == 0) {
    std::vector<Type> newElements(tupleType.begin(), tupleType.end());
    size_t injected = upTo(newElements.size());
    newElements[injected] = type;
    tupleType = Type(newElements);
    extractIndices.push_back(injected);
  }

  Index index = pick(extractIndices);
  Expression* child = make(tupleType);
  return builder.makeTupleExtract(child, index);
}